

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O3

int wally_addr_segwit_to_bytes
              (char *addr,char *addr_family,uint32_t flags,uchar *bytes_out,size_t len,
              size_t *written)

{
  char cVar1;
  size_t bytes_len;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  uchar decoded [40];
  uint8_t data [84];
  uint8_t local_118 [48];
  char local_e8 [90];
  undefined1 auStack_8e [6];
  byte local_88;
  uint8_t local_87 [87];
  
  if (written == (size_t *)0x0) {
    return -2;
  }
  *written = 0;
  if (len == 0) {
    return -2;
  }
  if (bytes_out == (uchar *)0x0) {
    return -2;
  }
  if (addr == (char *)0x0) {
    return -2;
  }
  if (addr_family == (char *)0x0) {
    return -2;
  }
  if (flags != 0) {
    return -2;
  }
  sVar6 = strlen(addr);
  if (0xffffffffffffffac < sVar6 - 0x5b) {
    sVar11 = 0;
    pcVar7 = addr;
    do {
      pcVar7 = pcVar7 + -1;
      sVar12 = sVar11;
      if (pcVar7[sVar6] == '1') break;
      sVar11 = sVar11 + 1;
      sVar12 = sVar6;
    } while (sVar6 != sVar11);
    uVar8 = sVar6 - (sVar12 + 1);
    if (5 < sVar12 && (sVar12 + 1 <= sVar6 && uVar8 != 0)) {
      lVar13 = uVar8 + (uVar8 == 0);
      bVar3 = false;
      bVar2 = false;
      uVar4 = 1;
      lVar9 = 0;
      do {
        cVar1 = addr[lVar9];
        uVar10 = (uint)cVar1;
        if (0x5d < (byte)(cVar1 - 0x21U)) goto LAB_0015a42c;
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          bVar2 = true;
        }
        else if ((byte)(cVar1 + 0xbfU) < 0x1a) {
          bVar3 = true;
          uVar10 = uVar10 | 0x20;
        }
        local_e8[lVar9] = (char)uVar10;
        uVar4 = bech32_polymod_step(uVar4);
        uVar4 = uVar10 >> 5 ^ uVar4;
        lVar9 = lVar9 + 1;
      } while (lVar13 != lVar9);
      local_e8[lVar13] = '\0';
      uVar4 = bech32_polymod_step(uVar4);
      lVar9 = 0;
      do {
        uVar4 = bech32_polymod_step(uVar4);
        uVar4 = (byte)addr[lVar9] & 0x1f ^ uVar4;
        lVar9 = lVar9 + 1;
      } while (lVar13 != lVar9);
      if (lVar13 + 1U < sVar6) {
        uVar14 = lVar13 + 7;
        do {
          cVar1 = addr[uVar14 - 6];
          if ((long)cVar1 < 0) {
            uVar10 = 0xffffffff;
          }
          else {
            uVar10 = (uint)charset_rev[cVar1];
          }
          if ((byte)(cVar1 + 0x9fU) < 0x1a) {
            bVar2 = true;
          }
          if ((byte)(cVar1 + 0xbfU) < 0x1a) {
            bVar3 = true;
          }
          if (uVar10 == 0xffffffff) goto LAB_0015a42c;
          uVar4 = bech32_polymod_step(uVar4);
          if (uVar14 < sVar6) {
            auStack_8e[uVar14 + ~uVar8] = (char)uVar10;
          }
          uVar4 = uVar4 ^ uVar10;
          lVar9 = (1 - sVar6) + uVar14;
          uVar14 = uVar14 + 1;
        } while (lVar9 != 6);
      }
      if ((!bVar2) || (!bVar3)) {
        if ((sVar12 - 7 < 0x41) &&
           ((uVar4 == 1 || uVar4 == 0x2bc830a3 &&
            (iVar5 = strncmp(addr_family,local_e8,0x54), iVar5 == 0)))) {
          if (local_88 == 0) {
            if (uVar4 != 0x2bc830a3) goto LAB_0015a675;
          }
          else if (local_88 < 0x11 && uVar4 == 0x2bc830a3) {
LAB_0015a675:
            *written = 0;
            iVar5 = convert_bits(local_118,written,8,local_87,sVar12 - 7,5,0);
            if (((iVar5 != 0) && (bytes_len = *written, 0xffffffffffffffd8 < bytes_len - 0x29)) &&
               ((local_88 != 0 || ((bytes_len == 0x14 || (bytes_len == 0x20)))))) {
              iVar5 = wally_witness_program_from_bytes_using_version
                                (local_118,bytes_len,local_88,0,bytes_out,len,written);
              goto LAB_0015a450;
            }
          }
        }
      }
    }
  }
LAB_0015a42c:
  wally_clear_2(&local_88,0x54,local_e8,0x54);
  iVar5 = -2;
LAB_0015a450:
  wally_clear(local_118,0x28);
  return iVar5;
}

Assistant:

int wally_addr_segwit_to_bytes(const char *addr, const char *addr_family,
                               uint32_t flags,
                               unsigned char *bytes_out, size_t len,
                               size_t *written)
{
    int witver = 0;
    unsigned char decoded[40];
    int ret;

    if (written)
        *written = 0;

    if (flags || !addr_family || !addr || !bytes_out || !len || !written)
        return WALLY_EINVAL;

    /* Only v0 witness programs are currently allowed */
    if (!segwit_addr_decode(&witver, decoded, written, addr_family, addr))
        ret = WALLY_EINVAL;
    else
        ret = wally_witness_program_from_bytes_using_version(
            decoded, *written, witver, flags, bytes_out, len, written);

    wally_clear(decoded, sizeof(decoded));
    return ret;
}